

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O0

int ON_RowReduce(int row_count,int col_count,double zero_pivot,double **A,double **B,double *pivots)

{
  double dVar1;
  double *pdVar2;
  bool bVar3;
  int iVar4;
  double *pdVar5;
  double *local_88;
  double *ptr1;
  double *ptr0;
  double p1;
  double p0;
  double p;
  double a;
  int local_50;
  int ii;
  int j;
  int i;
  size_t sizeof_row;
  int N;
  int M;
  double *pivots_local;
  double **B_local;
  double **A_local;
  double zero_pivot_local;
  int col_count_local;
  int row_count_local;
  
  if (pivots != (double *)0x0) {
    *pivots = 0.0;
    pivots[1] = 0.0;
  }
  if ((zero_pivot <= 0.0) ||
     (bVar3 = ON_IsValid(zero_pivot), A_local = (double **)zero_pivot, !bVar3)) {
    A_local = (double **)0x0;
  }
  for (ii = 0; ii < row_count; ii = ii + 1) {
    memset(B[ii],0,(long)col_count << 3);
    if (ii < col_count) {
      B[ii][ii] = 1.0;
    }
  }
  ptr0 = (double *)**A;
  p1 = (double)ptr0;
  for (ii = 0; ii < row_count; ii = ii + 1) {
    dVar1 = A[ii][ii];
    pdVar5 = (double *)ABS(dVar1);
    pdVar2 = pdVar5;
    if ((p1 <= (double)pdVar5) && (pdVar2 = (double *)p1, (double)ptr0 < (double)pdVar5)) {
      ptr0 = pdVar5;
    }
    p1 = (double)pdVar2;
    a._4_4_ = ii;
    if ((dVar1 != 1.0) || (NAN(dVar1))) {
      if (((double)pdVar5 <= (double)A_local) || (bVar3 = ON_IsValid(dVar1), !bVar3)) break;
      local_88 = A[ii] + (ii + 1);
      local_50 = col_count - (ii + 1);
      while (local_50 != 0) {
        *local_88 = (1.0 / dVar1) * *local_88;
        local_88 = local_88 + 1;
        local_50 = local_50 + -1;
      }
      local_88 = B[ii];
      local_50 = ii + 1;
      while (local_50 != 0) {
        *local_88 = (1.0 / dVar1) * *local_88;
        local_88 = local_88 + 1;
        local_50 = local_50 + -1;
      }
    }
    while (a._4_4_ = a._4_4_ + 1, a._4_4_ < row_count) {
      dVar1 = A[a._4_4_][ii];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        iVar4 = ii + 1;
        local_88 = A[a._4_4_] + iVar4;
        ptr1 = A[ii] + iVar4;
        local_50 = col_count - iVar4;
        while (local_50 != 0) {
          *local_88 = -dVar1 * *ptr1 + *local_88;
          local_88 = local_88 + 1;
          ptr1 = ptr1 + 1;
          local_50 = local_50 + -1;
        }
        for (local_50 = 0; local_50 <= ii; local_50 = local_50 + 1) {
          B[a._4_4_][local_50] = -dVar1 * B[ii][local_50] + B[a._4_4_][local_50];
        }
      }
    }
  }
  if (pivots != (double *)0x0) {
    *pivots = p1;
    pivots[1] = (double)ptr0;
  }
  if (ii < row_count) {
    col_count_local = ii;
  }
  else {
    for (ii = row_count + -1; col_count_local = row_count, a._4_4_ = ii, -1 < ii; ii = ii + -1) {
      while (a._4_4_ = a._4_4_ + -1, -1 < a._4_4_) {
        dVar1 = A[a._4_4_][ii];
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          local_88 = B[a._4_4_];
          ptr1 = B[ii];
          local_50 = col_count;
          while (local_50 != 0) {
            *local_88 = -dVar1 * *ptr1 + *local_88;
            local_88 = local_88 + 1;
            ptr1 = ptr1 + 1;
            local_50 = local_50 + -1;
          }
        }
      }
    }
  }
  return col_count_local;
}

Assistant:

int ON_RowReduce( int row_count, 
                  int col_count,
                  double zero_pivot,
                  double** A, 
                  double** B, 
                  double pivots[2] 
                 )
{
  // returned A is identity, B = inverse of input A
  const int M = row_count;
  const int N = col_count;
  const size_t sizeof_row = N*sizeof(A[0][0]);
  int i, j, ii;
  double a, p, p0, p1;
  const double* ptr0;
  double* ptr1;

  if ( pivots )
  {
    pivots[0] = 0.0;
    pivots[1] = 0.0;
  }

  if ( zero_pivot <= 0.0 || !ON_IsValid(zero_pivot) )
    zero_pivot = 0.0;


  for ( i = 0; i < M; i++ )
  {
    memset(B[i],0,sizeof_row);
    if ( i < N )
      B[i][i] = 1.0;
  }

  p0 = p1 = A[0][0];

  for ( i = 0; i < M; i++ )
  {
    p = fabs(a = A[i][i]);
    if ( p < p0 ) p0 = p; else if (p > p1) p1 = p;
    if ( 1.0 != a )
    {
      if ( p <= zero_pivot || !ON_IsValid(a) )
      {
        break;
      }
      a = 1.0/a;

      //A[i][i] = 1.0; // no need to do this

      // The "ptr" voodoo is faster but does the same thing as
      //
      //for ( j = i+1; j < N; j++ )
      //  A[i][j] *= a;
      //      
      j = i+1;
      ptr1 = A[i] + j;
      j = N - j;
      while(j--) *ptr1++ *= a;
      
      // The "ptr" voodoo is faster but does the same thing as
      //
      //for ( j = 0; j <= i; j++ )
      //  B[i][j] *= a;
      //            
      ptr1 = B[i];
      j = i+1;
      while(j--) *ptr1++ *= a;
    }

    for ( ii = i+1; ii < M; ii++ )
    {
      a = A[ii][i];
      if ( 0.0 == a )
        continue;
      a = -a;
      
      //A[ii][i] = 0.0;  // no need to do this

      // The "ptr" voodoo is faster but does the same thing as
      //
      //for( j = i+1; j < N; j++ )
      //  A[ii][j] += a*A[i][j];
      //
      j = i+1;
      ptr0 = A[i] + j;
      ptr1 = A[ii] + j;
      j = N - j;
      while(j--) *ptr1++ += a* *ptr0++;

      for( j = 0; j <= i; j++ )
        B[ii][j] += a*B[i][j];
    }
  }

  if ( pivots )
  {
    pivots[0] = p0;
    pivots[1] = p1;
  }

  if ( i < M )
  {
    return i;
  }


  // A is now upper triangular with all 1s on diagonal 
  //   (That is, if the lines that say "no need to do this" are used.)
  // B is lower triangular with a nonzero diagonal
  for ( i = M-1; i >= 0; i-- )
  {
    for ( ii = i-1; ii >= 0; ii-- )
    {
      a = A[ii][i];
      if ( 0.0 == a )
        continue;
      a = -a;
      //A[ii][i] = 0.0; // no need to do this

      // The "ptr" voodoo is faster but does the same thing as
      //
      //for( j = 0; j < N; j++ )
      //  B[ii][j] += a*B[i][j];
      //
      ptr0 = B[i];
      ptr1 = B[ii];
      j = N;
      while(j--) *ptr1++ += a* *ptr0++;
    }
  }

  // At this point, A is trash.
  // If the input A was really nice (positive definite....)
  // the B = inverse of the input A.  If A was not nice,
  // B is also trash.
  return M;
}